

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                 (redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *xpr)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  double adVar3 [2];
  CoeffReturnType local_f8;
  long local_f0;
  Index index_3;
  long local_e0;
  Index index_2;
  long local_d0;
  Index index_1;
  double local_b8 [2];
  double local_a8 [3];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *xpr_local;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *eval_local;
  
  IVar1 = EigenBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
          size((EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                *)xpr);
  index_00 = first_default_aligned<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                       ((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)xpr);
  lVar2 = ((IVar1 - index_00) / 2) * 2;
  index_01 = index_00 + ((IVar1 - index_00) / 4) * 4;
  if (lVar2 == 0) {
    packet_res0[1] =
         mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
         ::coeff((mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)eval,0);
    for (local_f0 = 1; local_f0 < IVar1; local_f0 = local_f0 + 1) {
      local_f8 = mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
                 ::coeff((mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)eval,local_f0);
      packet_res0[1] = scalar_sum_op<double,_double>::operator()(func,packet_res0 + 1,&local_f8);
    }
  }
  else {
    adVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Matrix<double,-1,1,0,-1,1>>
             ::packet<0,double__vector(2)>
                       ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
                         *)eval,index_00);
    packet_res1[1] = adVar3[0];
    if (2 < lVar2) {
      adVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Matrix<double,-1,1,0,-1,1>>
               ::packet<0,double__vector(2)>
                         ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
                           *)eval,index_00 + 2);
      index = adVar3[0];
      local_90 = index_00;
      while (local_90 = local_90 + 4, local_90 < index_01) {
        adVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,local_90);
        local_a8[0] = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)func,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])local_a8);
        packet_res1[1] = adVar3[0];
        adVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,local_90 + 2);
        local_b8[0] = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)func,(double (*) [2])&index,&local_b8);
        index = adVar3[0];
      }
      adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                         ((scalar_sum_op<double,double> *)func,(double (*) [2])(packet_res1 + 1),
                          (double (*) [2])&index);
      packet_res1[1] = adVar3[0];
      if (index_01 < index_00 + lVar2) {
        adVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,index_01);
        index_1 = adVar3[0];
        adVar3 = scalar_sum_op<double,double>::packetOp<double__vector(2)>
                           ((scalar_sum_op<double,double> *)func,(double (*) [2])(packet_res1 + 1),
                            (double (*) [2])&index_1);
        packet_res1[1] = adVar3[0];
      }
    }
    packet_res0[1] =
         scalar_sum_op<double,double>::predux<double__vector(2)>
                   ((scalar_sum_op<double,double> *)func,(double (*) [2])(packet_res1 + 1));
    for (local_d0 = 0; local_e0 = index_00 + lVar2, local_d0 < index_00; local_d0 = local_d0 + 1) {
      index_2 = (Index)mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
                       ::coeff((mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)eval,local_d0);
      packet_res0[1] =
           scalar_sum_op<double,_double>::operator()(func,packet_res0 + 1,(double *)&index_2);
    }
    for (; local_e0 < IVar1; local_e0 = local_e0 + 1) {
      index_3 = (Index)mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
                       ::coeff((mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)eval,local_e0);
      packet_res0[1] =
           scalar_sum_op<double,_double>::operator()(func,packet_res0 + 1,(double *)&index_3);
    }
  }
  return packet_res0[1];
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }